

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileInstaller.cxx
# Opt level: O0

void __thiscall
cmFileInstaller::ReportCopy(cmFileInstaller *this,string *toFile,Type type,bool copy)

{
  char *local_68;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string message;
  bool copy_local;
  Type type_local;
  string *toFile_local;
  cmFileInstaller *this_local;
  
  message.field_2._M_local_buf[0xb] = copy;
  message.field_2._12_4_ = type;
  if (((this->MessageNever & 1U) == 0) && ((copy || ((this->MessageLazy & 1U) == 0)))) {
    if (copy) {
      local_68 = "Installing: ";
    }
    else {
      local_68 = "Up-to-date: ";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_40,local_68,&local_41);
    std::allocator<char>::~allocator(&local_41);
    std::__cxx11::string::operator+=((string *)local_40,(string *)toFile);
    cmMakefile::DisplayStatus((this->super_cmFileCopier).Makefile,(string *)local_40,-1.0);
    std::__cxx11::string::~string((string *)local_40);
  }
  if (message.field_2._12_4_ != 1) {
    ManifestAppend(this,toFile);
  }
  return;
}

Assistant:

void cmFileInstaller::ReportCopy(const std::string& toFile, Type type,
                                 bool copy)
{
  if (!this->MessageNever && (copy || !this->MessageLazy)) {
    std::string message = (copy ? "Installing: " : "Up-to-date: ");
    message += toFile;
    this->Makefile->DisplayStatus(message, -1);
  }
  if (type != TypeDir) {
    // Add the file to the manifest.
    this->ManifestAppend(toFile);
  }
}